

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

void __thiscall QMessageBoxPrivate::setVisible(QMessageBoxPrivate *this,bool visible)

{
  long lVar1;
  char cVar2;
  QPushButton *pQVar3;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,visible) != 0) {
    if (this->autoAddOkButton == true) {
      lVar1 = *(long *)(*(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8 + 8);
      pQVar3 = QDialogButtonBox::addButton(*(QDialogButtonBox **)(lVar1 + 0x2f8),FirstButton);
      if (pQVar3 != (QPushButton *)0x0) {
        *(undefined1 *)(lVar1 + 0x349) = 0;
      }
    }
    detectEscapeButton(this);
  }
  cVar2 = (**(code **)(*(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate + 0xa8))(this);
  if (cVar2 != '\0') {
    QDialogPrivate::setNativeDialogVisible(&this->super_QDialogPrivate,visible);
  }
  QWidget::setAttribute
            (*(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8,
             WA_DontShowOnScreen,(this->super_QDialogPrivate).nativeDialogInUse);
  QDialogPrivate::setVisible(&this->super_QDialogPrivate,visible);
  return;
}

Assistant:

void QMessageBoxPrivate::setVisible(bool visible)
{
    // Last minute setup
    if (visible) {
        Q_Q(QMessageBox);
        if (autoAddOkButton)
            q->addButton(QMessageBox::Ok);
        detectEscapeButton();
    }
    // On hide, we may be called from ~QDialog(), so prevent accessing
    // q_ptr as a QMessageBox!

    if (canBeNativeDialog())
        setNativeDialogVisible(visible);

    // Update WA_DontShowOnScreen based on whether the native dialog was shown,
    // so that QDialog::setVisible(visible) below updates the QWidget state correctly,
    // but skips showing the non-native version.
    static_cast<QWidget*>(q_ptr)->setAttribute(Qt::WA_DontShowOnScreen, nativeDialogInUse);

    QDialogPrivate::setVisible(visible);
}